

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubtreeWrapper.cpp
# Opt level: O2

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CRelativeConditionalWrapper::ToConditional
          (CRelativeConditionalWrapper *this,CLabel *labelTrue,CLabel *labelFalse)

{
  size_type sVar1;
  CJumpConditionalStatement *pCVar2;
  CLabelStatement *pCVar3;
  string *in_RCX;
  pointer *__ptr;
  _Head_base<0UL,_const_IRT::CLabelStatement_*,_false> local_98;
  __uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_90;
  _Head_base<0UL,_const_IRT::CLabelStatement_*,_false> local_88;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_80;
  CJumpConditionalStatement *local_78;
  CLabel local_70;
  CLabel local_50;
  
  local_78 = (CJumpConditionalStatement *)operator_new(0x30);
  sVar1 = (labelTrue->label)._M_string_length;
  local_80._M_head_impl = (CExpression *)(labelTrue->label).field_2._M_allocated_capacity;
  (labelTrue->label).field_2._M_allocated_capacity = 0;
  local_90._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
       *(tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_> *)
        &((_Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           *)((long)&(labelTrue->label).field_2 + 8))->
         super__Head_base<0UL,_const_IRT::CExpression_*,_false>;
  *(undefined8 *)((long)&(labelTrue->label).field_2 + 8) = 0;
  pCVar3 = (CLabelStatement *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_50,(string *)labelFalse);
  CLabelStatement::CLabelStatement(pCVar3,&local_50);
  local_98._M_head_impl = pCVar3;
  pCVar3 = (CLabelStatement *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_70,in_RCX);
  CLabelStatement::CLabelStatement(pCVar3,&local_70);
  pCVar2 = local_78;
  local_88._M_head_impl = pCVar3;
  CJumpConditionalStatement::CJumpConditionalStatement
            (local_78,(TLogicOperator)sVar1,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_80,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_90,
             (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)&local_98,
             (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)&local_88);
  (this->super_CConditionalWrapper).super_ISubtreeWrapper._vptr_ISubtreeWrapper =
       (_func_int **)pCVar2;
  if (local_88._M_head_impl != (CLabelStatement *)0x0) {
    (*((local_88._M_head_impl)->super_CStatement).super_IStatement.super_INode._vptr_INode[2])();
  }
  local_88._M_head_impl = (CLabelStatement *)0x0;
  std::__cxx11::string::~string((string *)&local_70);
  if (local_98._M_head_impl != (CLabelStatement *)0x0) {
    (*((local_98._M_head_impl)->super_CStatement).super_IStatement.super_INode._vptr_INode[2])();
  }
  local_98._M_head_impl = (CLabelStatement *)0x0;
  std::__cxx11::string::~string((string *)&local_50);
  if (local_90._M_t.
      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)0x0)
  {
    (**(code **)((long)*(IExpression *)
                        local_90._M_t.
                        super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                        .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl + 0x10)
    )();
  }
  local_90._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
       (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
       (_Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)0x0
  ;
  if (local_80._M_head_impl != (CExpression *)0x0) {
    (*((local_80._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CStatement>
    CRelativeConditionalWrapper::ToConditional( CLabel labelTrue, CLabel labelFalse ) {
        return std::move( std::unique_ptr<const CStatement>(
                new CJumpConditionalStatement(
                        operatorType,
                        std::move( operandLeft ),
                        std::move( operandRight ),
                        std::move( std::unique_ptr<const CLabelStatement>( new CLabelStatement( labelTrue ))),
                        std::move( std::unique_ptr<const CLabelStatement>( new CLabelStatement( labelFalse )))
                )
        ));
    }